

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

void __thiscall cmCTestHG::LogParser::StartElement(LogParser *this,string *name,char **atts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  pointer pcVar1;
  bool bVar2;
  char *pcVar3;
  Revision local_128;
  
  pcVar1 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  bVar2 = std::operator==(name,"logentry");
  if (bVar2) {
    __s = &local_128.Rev.field_2;
    memset(__s,0,0xf0);
    local_128.Rev._M_string_length = 0;
    local_128.Date._M_dataplus._M_p = (pointer)&local_128.Date.field_2;
    local_128.Date.field_2._M_local_buf[0] = '\0';
    local_128.Author._M_dataplus._M_p = (pointer)&local_128.Author.field_2;
    local_128.Author.field_2._M_local_buf[0] = '\0';
    local_128.EMail._M_dataplus._M_p = (pointer)&local_128.EMail.field_2;
    local_128.EMail.field_2._M_local_buf[0] = '\0';
    local_128.Committer._M_dataplus._M_p = (pointer)&local_128.Committer.field_2;
    local_128.Committer.field_2._M_local_buf[0] = '\0';
    local_128.CommitterEMail._M_dataplus._M_p = (pointer)&local_128.CommitterEMail.field_2;
    local_128.CommitterEMail.field_2._M_local_buf[0] = '\0';
    local_128.CommitDate._M_dataplus._M_p = (pointer)&local_128.CommitDate.field_2;
    local_128.CommitDate.field_2._M_local_buf[0] = '\0';
    local_128.Log._M_dataplus._M_p = (pointer)&local_128.Log.field_2;
    local_128.Log.field_2._M_local_buf[0] = '\0';
    local_128.Rev._M_dataplus._M_p = (pointer)__s;
    cmCTestVC::Revision::operator=(&this->Rev,&local_128);
    cmCTestVC::Revision::~Revision(&local_128);
    pcVar3 = cmXMLParser::FindAttribute(atts,"revision");
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->Rev);
    }
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::clear
              (&this->Changes);
  }
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) CM_OVERRIDE
  {
    this->CData.clear();
    if (name == "logentry") {
      this->Rev = Revision();
      if (const char* rev = this->FindAttribute(atts, "revision")) {
        this->Rev.Rev = rev;
      }
      this->Changes.clear();
    }
  }